

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

size_t __thiscall VFS::CVFS::CVFSFile::Read(CVFSFile *this,char *Buf,size_t Size,size_t CurPos)

{
  pointer psVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  mutex *__mutex;
  ulong uVar6;
  size_t sVar7;
  Chunk c;
  __shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __mutex = &(this->super_CVFSNode).m_UpdateLock;
  std::mutex::lock(__mutex);
  uVar6 = CurPos >> 0xc;
  sVar7 = 0;
  do {
    if ((Size <= sVar7) ||
       (psVar1 = (this->m_Data).
                 super__Vector_base<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (ulong)((long)(this->m_Data).
                     super__Vector_base<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar6))
    break;
    std::__shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &psVar1[uVar6].
                super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>);
    uVar4 = CurPos + uVar6 * -0x1000;
    uVar5 = 0;
    if (uVar4 < 0x1001) {
      uVar5 = uVar4;
    }
    uVar3 = (local_40._M_ptr)->Filled - (int)uVar5;
    if (Size <= (ulong)(long)(int)uVar3) {
      uVar3 = (uint)Size;
    }
    if (0 < (int)uVar3) {
      memcpy(Buf + sVar7,(local_40._M_ptr)->Data + uVar5,(ulong)(uVar3 & 0x7fffffff));
      sVar7 = sVar7 + (uVar3 & 0x7fffffff);
      uVar6 = uVar6 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  } while (0 < (int)uVar3);
  lVar2 = std::chrono::_V2::system_clock::now();
  (this->super_CVFSNode).m_Accessed = lVar2 / 1000000000;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return sVar7;
}

Assistant:

size_t Read(char *Buf, size_t Size, size_t CurPos)
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);

                        size_t ChunkPos = CurPos / CHUNK_SIZE; //Calculates the beginning chunk.
                        size_t Readed = 0;

                        while (Readed < Size)
                        {
                            if(ChunkPos >= m_Data.size())
                                break;

                            Chunk c = m_Data[ChunkPos];
                            size_t Pos = CurPos - ChunkPos * CHUNK_SIZE;
                            Pos = (Pos > CHUNK_SIZE) ? 0 : Pos;

                            int CopyCount = c->Filled - Pos;
                            CopyCount = CopyCount > Size ? Size : CopyCount;    //Calculate the right copy size.
                            if(CopyCount <= 0)
                                break;

                            memcpy(Buf + Readed, c->Data + Pos, CopyCount);
                            Readed += CopyCount;
                            ChunkPos++;
                        }
                        
                        m_Accessed = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
                        return Readed;
                    }